

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_data_p.h
# Opt level: O0

array<char,_4UL> __thiscall AlphaCode::decode(AlphaCode *this)

{
  long lVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  array<char,_4UL> aVar5;
  ushort *in_RDI;
  long in_FS_OFFSET;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = m2c(*in_RDI & 0x1f);
  cVar3 = m2c(*in_RDI >> 5 & 0x1f);
  cVar4 = m2c(*in_RDI >> 10 & 0x1f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    aVar5._M_elems[0] = cVar2;
    aVar5._M_elems[1] = cVar3;
    aVar5._M_elems[2] = cVar4;
    aVar5._M_elems[3] = '\0';
    return (array<char,_4UL>)aVar5._M_elems;
  }
  __stack_chk_fail();
}

Assistant:

std::array<char, 4> decode() const { return {m2c(c1), m2c(c2), m2c(c3), 0}; }